

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::UnicodeString::unescape(UnicodeString *__return_storage_ptr__,UnicodeString *this)

{
  short sVar1;
  ushort uVar2;
  UChar32 srcChar;
  ushort uVar3;
  int iVar4;
  int32_t length;
  int iVar5;
  int32_t iVar6;
  char16_t *srcChars;
  int32_t i;
  int32_t local_34;
  
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar6 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar6 = (int)sVar1 >> 5;
  }
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00401be0;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 0;
  allocate(__return_storage_ptr__,iVar6);
  if ((undefined1  [56])((undefined1  [56])__return_storage_ptr__->fUnion & (undefined1  [56])0x1)
      == (undefined1  [56])0x0) {
    uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar2 & 0x11) == 0) {
      if ((uVar2 & 2) == 0) {
        srcChars = (this->fUnion).fFields.fArray;
      }
      else {
        srcChars = (this->fUnion).fStackFields.fBuffer;
      }
    }
    else {
      srcChars = (char16_t *)0x0;
    }
    if ((short)uVar2 < 0) {
      iVar5 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)(short)uVar2 >> 5;
    }
    local_34 = 0;
    if (iVar5 == 0) {
      iVar6 = 0;
    }
    else {
      local_34 = 0;
      iVar6 = 0;
      do {
        iVar4 = local_34 + 1;
        if (srcChars[local_34] == L'\\') {
          iVar4 = local_34 - iVar6;
          local_34 = local_34 + 1;
          doAppend(__return_storage_ptr__,srcChars,iVar6,iVar4);
          sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            length = (this->fUnion).fFields.fLength;
          }
          else {
            length = (int)sVar1 >> 5;
          }
          srcChar = u_unescapeAt_63(UnicodeString_charAt,&local_34,length,this);
          if (srcChar < 0) {
            uVar2 = (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags;
            uVar3 = uVar2 & 0x1e;
            if ((uVar2 & 1) != 0) {
              uVar3 = 2;
            }
            (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = uVar3;
          }
          else {
            append(__return_storage_ptr__,srcChar);
            iVar6 = local_34;
          }
          iVar4 = local_34;
          if (srcChar < 0) {
            return __return_storage_ptr__;
          }
        }
        local_34 = iVar4;
      } while (local_34 != iVar5);
    }
    doAppend(__return_storage_ptr__,srcChars,iVar6,iVar5 - iVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString UnicodeString::unescape() const {
    UnicodeString result(length(), (UChar32)0, (int32_t)0); // construct with capacity
    if (result.isBogus()) {
        return result;
    }
    const UChar *array = getBuffer();
    int32_t len = length();
    int32_t prev = 0;
    for (int32_t i=0;;) {
        if (i == len) {
            result.append(array, prev, len - prev);
            break;
        }
        if (array[i++] == 0x5C /*'\\'*/) {
            result.append(array, prev, (i - 1) - prev);
            UChar32 c = unescapeAt(i); // advances i
            if (c < 0) {
                result.remove(); // return empty string
                break; // invalid escape sequence
            }
            result.append(c);
            prev = i;
        }
    }
    return result;
}